

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O2

KeyData * __thiscall
cfd::core::Descriptor::GetKeyData(KeyData *__return_storage_ptr__,Descriptor *this)

{
  uint32_t uVar1;
  CfdException *this_00;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> key_list;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  
  uVar1 = DescriptorNode::GetNeedArgumentNum(&this->root_node_);
  if (uVar1 == 0) {
    list.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    list.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    list.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    GetKeyDataAll(&key_list,this,&list);
    if ((KeyData *)
        CONCAT44(key_list.
                 super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl
                 .super__Vector_impl_data._M_start._4_4_,
                 (uint32_t)
                 key_list.
                 super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl
                 .super__Vector_impl_data._M_start) ==
        key_list.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl
        .super__Vector_impl_data._M_finish) {
      KeyData::KeyData(__return_storage_ptr__);
    }
    else {
      KeyData::KeyData(__return_storage_ptr__,
                       (KeyData *)
                       CONCAT44(key_list.
                                super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>
                                ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                (uint32_t)
                                key_list.
                                super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>
                                ._M_impl.super__Vector_impl_data._M_start));
    }
    ::std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector(&key_list);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&list);
    return __return_storage_ptr__;
  }
  list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x4afac5;
  list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)CONCAT44(list.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish._4_4_,0x89d);
  list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_4eeabe;
  key_list.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = uVar1;
  logger::warn<unsigned_int>
            ((CfdSourceLocation *)&list,"Failed to empty argument. {}",(uint *)&key_list);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)&list,"Failed to empty argument. need argument descriptor.",
             (allocator *)&key_list);
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)&list);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

KeyData Descriptor::GetKeyData() const {
  if (GetNeedArgumentNum() != 0) {
    warn(CFD_LOG_SOURCE, "Failed to empty argument. {}", GetNeedArgumentNum());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to empty argument. need argument descriptor.");
  }
  std::vector<std::string> list;
  auto key_list = GetKeyDataAll(&list);
  if (key_list.empty()) return KeyData();
  return key_list[0];
}